

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson.c
# Opt level: O2

double delUVbyDelZ(double **U,double **V,int i,int j,int z,double alpha,double delz)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  lVar4 = (long)i;
  pdVar2 = U[lVar4 + 1];
  lVar3 = (long)j;
  dVar6 = pdVar2[lVar3];
  dVar7 = dVar6 + pdVar2[lVar3 + 1];
  dVar8 = V[lVar4][lVar3 + 1];
  dVar1 = V[lVar4 + 1][lVar3 + 1];
  dVar9 = dVar8 + dVar1;
  dVar5 = dVar7 * dVar9;
  if (z == 1) {
    dVar6 = U[lVar4][lVar3] + U[lVar4][lVar3 + 1];
    dVar5 = dVar5 - (dVar8 + V[lVar4 + -1][lVar3 + 1]) * dVar6;
    if ((alpha == 0.0) && (!NAN(alpha))) goto LAB_0010361f;
    dVar6 = (dVar8 - dVar1) * ABS(dVar7) - ABS(dVar6) * (V[lVar4 + -1][lVar3 + 1] - dVar8);
  }
  else {
    dVar8 = V[lVar4][lVar3] + V[lVar4 + 1][lVar3];
    dVar5 = dVar5 - (dVar6 + pdVar2[lVar3 + -1]) * dVar8;
    if ((alpha == 0.0) && (!NAN(alpha))) goto LAB_0010361f;
    dVar6 = (dVar6 - pdVar2[lVar3 + 1]) * ABS(dVar9) - ABS(dVar8) * (pdVar2[lVar3 + -1] - dVar6);
  }
  dVar5 = dVar5 + alpha * dVar6;
LAB_0010361f:
  return dVar5 / (delz * 4.0);
}

Assistant:

REAL delUVbyDelZ (REAL **U, REAL **V, int i, int j, int z, REAL alpha, REAL delz)
{
	REAL duvdz = (U[i+1][j] + U[i+1][j+1])*(V[i][j+1] + V[i+1][j+1]);
	REAL correctionTerm = 0;
	delz *= 4;
	if (z == DERIVE_BY_X)
	{
		duvdz -= (U[i][j] + U[i][j+1])*(V[i-1][j+1] + V[i][j+1]);
		if (alpha == 0)
			return duvdz/delz;
		correctionTerm = fabs(U[i+1][j] + U[i+1][j+1]) * (V[i][j+1] - V[i+1][j+1]);
		correctionTerm -= fabs(U[i][j]+U[i][j+1]) * (V[i-1][j+1] - V[i][j+1]);
	}
	else
	{
		duvdz -= (U[i+1][j-1] + U[i+1][j])*(V[i][j] + V[i+1][j]);
		if (alpha == 0)
			return duvdz/delz;
		correctionTerm = fabs(V[i][j+1] + V[i+1][j+1]) * (U[i+1][j] - U[i+1][j+1]);
		correctionTerm -= fabs(V[i][j] + V[i+1][j]) * (U[i+1][j-1] - U[i+1][j]);
	}
	return (duvdz + alpha*correctionTerm)/delz;
}